

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

bool SoapySDRDevice_hasDCOffset(SoapySDRDevice *device,int direction,size_t channel)

{
  byte bVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  exception *ex;
  
  SoapySDRDevice_clearError();
  bVar1 = (**(code **)(*in_RDI + 0x108))(in_RDI,in_ESI,in_RDX);
  return (bool)(bVar1 & 1);
}

Assistant:

bool SoapySDRDevice_hasDCOffset(const SoapySDRDevice *device, const int direction, const size_t channel)
{
    __SOAPY_SDR_C_TRY
    return device->hasDCOffset(direction, channel);
    __SOAPY_SDR_C_CATCH_RET(SoapySDRBoolErr);
}